

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O1

long vorbis_book_decodevs_add(codebook *book,ogg_int32_t *a,oggpack_buffer *b,int n,int point)

{
  long lVar1;
  long lVar2;
  oggpack_buffer *poVar3;
  uint uVar4;
  long lVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  oggpack_buffer *apoStack_50 [2];
  ulong local_40;
  long local_38;
  
  apoStack_50[1] = b;
  if (0 < book->used_entries) {
    local_38 = (long)n / book->dim;
    uVar4 = (uint)local_38;
    lVar1 = -((long)(int)uVar4 * 8 + 0xfU & 0xfffffffffffffff0);
    lVar2 = lVar1 + -0x48;
    iVar7 = point - book->binarypoint;
    bVar6 = (byte)iVar7;
    if (iVar7 < 0) {
      if (0 < (int)uVar4) {
        local_40 = (ulong)(uVar4 & 0x7fffffff);
        uVar8 = 0;
        do {
          poVar3 = apoStack_50[1];
          *(undefined8 *)((long)apoStack_50 + lVar1) = 0x120934;
          lVar5 = decode_packed_entry_number(book,poVar3);
          if (lVar5 == -1) {
            return -1;
          }
          *(ogg_int32_t **)((long)apoStack_50 + uVar8 * 8 + lVar2 + 0x50) =
               book->valuelist + lVar5 * book->dim;
          uVar8 = uVar8 + 1;
        } while (local_40 != uVar8);
      }
      lVar1 = book->dim;
      if (0 < lVar1) {
        uVar4 = (uint)local_38;
        lVar5 = 0;
        do {
          if (0 < (int)uVar4) {
            uVar8 = 0;
            do {
              a[uVar8] = a[uVar8] +
                         (*(int *)(*(long *)((long)apoStack_50 + uVar8 * 8 + lVar2 + 0x50) +
                                  lVar5 * 4) << (-bVar6 & 0x1f));
              uVar8 = uVar8 + 1;
            } while ((uVar4 & 0x7fffffff) != uVar8);
          }
          lVar5 = lVar5 + 1;
          a = a + (int)uVar4;
        } while (lVar5 != lVar1);
        return 0;
      }
    }
    else {
      if (0 < (int)uVar4) {
        local_40 = (ulong)(uVar4 & 0x7fffffff);
        uVar8 = 0;
        do {
          poVar3 = apoStack_50[1];
          *(undefined8 *)((long)apoStack_50 + lVar1) = 0x120899;
          lVar5 = decode_packed_entry_number(book,poVar3);
          if (lVar5 == -1) {
            return -1;
          }
          *(ogg_int32_t **)((long)apoStack_50 + uVar8 * 8 + lVar2 + 0x50) =
               book->valuelist + lVar5 * book->dim;
          uVar8 = uVar8 + 1;
        } while (local_40 != uVar8);
      }
      lVar1 = book->dim;
      if (0 < lVar1) {
        uVar4 = (uint)local_38;
        lVar5 = 0;
        do {
          if (0 < (int)uVar4) {
            uVar8 = 0;
            do {
              a[uVar8] = a[uVar8] +
                         (*(int *)(*(long *)((long)apoStack_50 + uVar8 * 8 + lVar2 + 0x50) +
                                  lVar5 * 4) >> (bVar6 & 0x1f));
              uVar8 = uVar8 + 1;
            } while ((uVar4 & 0x7fffffff) != uVar8);
          }
          lVar5 = lVar5 + 1;
          a = a + (int)uVar4;
        } while (lVar5 != lVar1);
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

long vorbis_book_decodevs_add(codebook *book,ogg_int32_t *a,
			      oggpack_buffer *b,int n,int point){
  if(book->used_entries>0){  
    int step=n/book->dim;
    long *entry = (long *)alloca(sizeof(*entry)*step);
    ogg_int32_t **t = (ogg_int32_t **)alloca(sizeof(*t)*step);
    int i,j,o;
    int shift=point-book->binarypoint;
    
    if(shift>=0){
      for (i = 0; i < step; i++) {
	entry[i]=decode_packed_entry_number(book,b);
	if(entry[i]==-1)return(-1);
	t[i] = book->valuelist+entry[i]*book->dim;
      }
      for(i=0,o=0;i<book->dim;i++,o+=step)
	for (j=0;j<step;j++)
	  a[o+j]+=t[j][i]>>shift;
    }else{
      for (i = 0; i < step; i++) {
	entry[i]=decode_packed_entry_number(book,b);
	if(entry[i]==-1)return(-1);
	t[i] = book->valuelist+entry[i]*book->dim;
      }
      for(i=0,o=0;i<book->dim;i++,o+=step)
	for (j=0;j<step;j++)
	  a[o+j]+=t[j][i]<<-shift;
    }
  }
  return(0);
}